

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::AttrHelper_Vec3DAsVec2fArrToString
          (X3DExporter *this,aiVector3D *pArray,size_t pArray_Size,string *pTargetString)

{
  size_type sVar1;
  pointer pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  size_type sVar7;
  string *__range2;
  ulong uVar8;
  undefined8 uVar9;
  float *pfVar10;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)pTargetString);
  if (pArray_Size != 0) {
    pfVar10 = &pArray->y;
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",SUB84((double)((aiVector3D *)(pfVar10 + -1))->x,0));
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar5) {
        local_a0 = *puVar5;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *puVar5;
        local_b0 = (ulong *)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_70,vsnprintf,0x3a,"%f",SUB84((double)*pfVar10,0));
      uVar8 = 0xf;
      if (local_b0 != &local_a0) {
        uVar8 = local_a0;
      }
      if (uVar8 < local_70._M_string_length + local_a8) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar9 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_70._M_string_length + local_a8) goto LAB_0034a35d;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
      }
      else {
LAB_0034a35d:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p)
        ;
      }
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_c0 = *plVar3;
        uStack_b8 = puVar4[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar3;
        local_d0 = (long *)*puVar4;
      }
      local_c8 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)plVar3 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_90 = &local_80;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar3[3];
      }
      else {
        local_80 = *plVar6;
        local_90 = (long *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)pTargetString,(ulong)local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pfVar10 = pfVar10 + 3;
      pArray_Size = pArray_Size - 1;
    } while (pArray_Size != 0);
  }
  std::__cxx11::string::resize((ulong)pTargetString,(char)pTargetString->_M_string_length + -1);
  sVar1 = pTargetString->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (pTargetString->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      if (pcVar2[sVar7] == ',') {
        pcVar2[sVar7] = '.';
      }
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Vec3DAsVec2fArrToString(const aiVector3D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 4);// (Number + space) * 2.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].x) + " " + to_string(pArray[idx].y) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}